

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hh
# Opt level: O0

Any * __thiscall Any::operator=(Any *this,Any *a)

{
  bool bVar1;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  Any local_28;
  Any *a_local;
  Any *this_local;
  
  local_28.tp_index_._M_target = (type_info *)a;
  a_local = this;
  bVar1 = std::operator==(&this->ptr_,&a->ptr_);
  if (!bVar1) {
    clone(&local_28,(__fn *)local_28.tp_index_._M_target,__child_stack,in_ECX,in_R8);
    std::unique_ptr<Any::Base_,_std::default_delete<Any::Base_>_>::operator=
              (&this->ptr_,&local_28.ptr_);
    std::unique_ptr<Any::Base_,_std::default_delete<Any::Base_>_>::~unique_ptr(&local_28.ptr_);
    (this->tp_index_)._M_target = local_28.tp_index_._M_target[8];
  }
  return this;
}

Assistant:

Any& operator=(const Any& a)
	{
		if (ptr_ == a.ptr_)
			return *this;

		ptr_ = a.clone();
		tp_index_ = a.tp_index_;
		return *this;
	}